

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O2

spv_result_t
spvtools::val::anon_unknown_0::ValidateOperandLexicalScope
          (ValidationState_t *_,string *debug_inst_name,Instruction *inst,uint32_t word_index,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *ext_inst_name)

{
  bool bVar1;
  spv_result_t sVar2;
  function<bool_(CommonDebugInfoInstructions)> expectation;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  DiagnosticStream local_208;
  
  expectation.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  expectation.super__Function_base._M_functor._8_8_ = 0;
  expectation._M_invoker =
       std::
       _Function_handler<bool_(CommonDebugInfoInstructions),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_extensions.cpp:231:7)>
       ::_M_invoke;
  expectation.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(CommonDebugInfoInstructions),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_extensions.cpp:231:7)>
       ::_M_manager;
  bVar1 = DoesDebugInfoOperandMatchExpectation(_,&expectation,inst,word_index);
  sVar2 = SPV_SUCCESS;
  if (!bVar1) {
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator()(&local_228,ext_inst_name);
    std::operator<<((ostream *)&local_208,(string *)&local_228);
    std::operator<<((ostream *)&local_208,": ");
    std::operator<<((ostream *)&local_208,"expected operand ");
    std::operator<<((ostream *)&local_208,(string *)debug_inst_name);
    std::operator<<((ostream *)&local_208," must be a result id of a lexical scope");
    std::__cxx11::string::_M_dispose();
    DiagnosticStream::~DiagnosticStream(&local_208);
    sVar2 = local_208.error_;
  }
  if (expectation.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*expectation.super__Function_base._M_manager)
              ((_Any_data *)&expectation,(_Any_data *)&expectation,__destroy_functor);
  }
  return sVar2;
}

Assistant:

spv_result_t ValidateOperandLexicalScope(
    ValidationState_t& _, const std::string& debug_inst_name,
    const Instruction* inst, uint32_t word_index,
    const std::function<std::string()>& ext_inst_name) {
  std::function<bool(CommonDebugInfoInstructions)> expectation =
      [](CommonDebugInfoInstructions dbg_inst) {
        return dbg_inst == CommonDebugInfoDebugCompilationUnit ||
               dbg_inst == CommonDebugInfoDebugFunction ||
               dbg_inst == CommonDebugInfoDebugLexicalBlock ||
               dbg_inst == CommonDebugInfoDebugTypeComposite;
      };
  if (DoesDebugInfoOperandMatchExpectation(_, expectation, inst, word_index))
    return SPV_SUCCESS;

  return _.diag(SPV_ERROR_INVALID_DATA, inst)
         << ext_inst_name() << ": "
         << "expected operand " << debug_inst_name
         << " must be a result id of a lexical scope";
}